

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rf5c68.c
# Opt level: O2

void rf5c68_update(void *info,UINT32 samples,DEV_SMPL **outputs)

{
  size_t __n;
  ushort uVar1;
  DEV_SMPL *__s;
  DEV_SMPL *__s_00;
  long lVar2;
  byte bVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  
  __s = *outputs;
  __s_00 = outputs[1];
  __n = (ulong)samples * 4;
  memset(__s,0,__n);
  memset(__s_00,0,__n);
  lVar2 = *(long *)((long)info + 0x90);
  if ((lVar2 != 0) && (*(char *)((long)info + 0x8a) != '\0')) {
    for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
      lVar5 = lVar4 * 0x10;
      if ((*(char *)((long)info + lVar5 + 8) != '\0') &&
         (*(char *)((long)info + lVar5 + 0x14) == '\0')) {
        bVar3 = *(byte *)((long)info + lVar5 + 10);
        uVar6 = (uint)*(byte *)((long)info + lVar5 + 9);
        iVar8 = (bVar3 & 0xf) * uVar6;
        iVar7 = (bVar3 >> 4) * uVar6;
        for (uVar9 = 0; samples != uVar9; uVar9 = uVar9 + 1) {
          uVar6 = *(uint *)((long)info + lVar5 + 0xc);
          if ((*(code **)((long)info + 0x98) != (code *)0x0) && ((uVar6 & 0x7ff800) == 0x7ff800)) {
            (**(code **)((long)info + 0x98))(*(undefined8 *)((long)info + 0xa0),uVar6 >> 0x18);
            lVar2 = *(long *)((long)info + 0x90);
            uVar6 = *(uint *)((long)info + lVar5 + 0xc);
          }
          bVar3 = *(byte *)(lVar2 + (ulong)(uVar6 >> 0xb & 0xffff));
          if (bVar3 == 0xff) {
            uVar1 = *(ushort *)((long)info + lVar5 + 0x12);
            uVar6 = (uint)uVar1 << 0xb;
            *(uint *)((long)info + lVar5 + 0xc) = uVar6;
            bVar3 = *(byte *)(lVar2 + (ulong)uVar1);
            if (bVar3 == 0xff) break;
          }
          *(uint *)((long)info + lVar5 + 0xc) = *(ushort *)((long)info + lVar5 + 0x10) + uVar6;
          uVar6 = (uint)bVar3;
          if ((char)bVar3 < '\0') {
            __s[uVar9] = __s[uVar9] + ((uVar6 & 0x7f) * iVar8 >> 5);
            __s_00[uVar9] = __s_00[uVar9] + ((uVar6 & 0x7f) * iVar7 >> 5);
          }
          else {
            __s[uVar9] = __s[uVar9] - (iVar8 * uVar6 >> 5);
            __s_00[uVar9] = __s_00[uVar9] - (uVar6 * iVar7 >> 5);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void rf5c68_update(void *info, UINT32 samples, DEV_SMPL **outputs)
{
	rf5c68_state *chip = (rf5c68_state *)info;
	DEV_SMPL *left = outputs[0];
	DEV_SMPL *right = outputs[1];
	UINT8 i;
	UINT32 j;

	/* start with clean buffers */
	memset(left, 0, samples * sizeof(*left));
	memset(right, 0, samples * sizeof(*right));

	/* bail if not enabled */
	if (chip->data == NULL || !chip->enable)
		return;

	/* loop over channels */
	for (i = 0; i < NUM_CHANNELS; i++)
	{
		pcm_channel *chan = &chip->chan[i];

		/* if this channel is active, accumulate samples */
		if (chan->enable && ! chan->Muted)
		{
			int lv = (chan->pan & 0x0f) * chan->env;
			int rv = ((chan->pan >> 4) & 0x0f) * chan->env;

			/* loop over the sample buffer */
			for (j = 0; j < samples; j++)
			{
				int sample;

				/* trigger sample callback */
				if(chip->sample_end_cb)
				{
					if(((chan->addr >> 11) & 0xfff) == 0xfff)
						chip->sample_end_cb(chip->sample_cb_param,(chan->addr >> 11)/0x2000);
				}

				/* fetch the sample and handle looping */
				sample = chip->data[(chan->addr >> 11) & 0xffff];
				if (sample == 0xff)
				{
					chan->addr = chan->loopst << 11;
					sample = chip->data[(chan->addr >> 11) & 0xffff];

					/* if we loop to a loop point, we're effectively dead */
					if (sample == 0xff)
						break;
				}
				chan->addr += chan->step;

				/* add to the buffer */
				if (sample & 0x80)
				{
					sample &= 0x7f;
					left[j] += (sample * lv) >> 5;
					right[j] += (sample * rv) >> 5;
				}
				else
				{
					left[j] -= (sample * lv) >> 5;
					right[j] -= (sample * rv) >> 5;
				}
			}
		}
	}
	
#if 0	// IMO this is completely useless.
	/* now clamp and shift the result (output is only 10 bits) */
	for (j = 0; j < samples; j++)
	{
		DEV_SMPL temp;

		temp = left[j];
		if (temp > 32767) temp = 32767;
		else if (temp < -32768) temp = -32768;
		left[j] = temp & ~0x3f;

		temp = right[j];
		if (temp > 32767) temp = 32767;
		else if (temp < -32768) temp = -32768;
		right[j] = temp & ~0x3f;
	}
#endif
}